

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O1

void presolve::dev_kkt_check::checkDualFeasibility(State *state,KktConditionDetails *details)

{
  vector<double,_std::allocator<double>_> **ppvVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  details->type = kPrimalFeasibility;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  details->checked = 0;
  details->violated = 0;
  if (0 < state->numCol) {
    ppvVar1 = &state->colDual;
    lVar9 = 0;
    do {
      if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar9] != 0) {
        details->checked = details->checked + 1;
        dVar3 = (state->colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        iVar8 = (int)lVar9;
        if ((-INFINITY < dVar3) ||
           ((state->colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar9] < INFINITY)) {
          dVar4 = (state->colValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar9];
          if ((dVar4 != dVar3) ||
             ((state->colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar9] <= dVar3)) {
            dVar11 = (state->colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
            dVar10 = 0.0;
            if (((dVar4 == dVar11) && (dVar3 < dVar11)) &&
               (1e-07 < ((*ppvVar1)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar9])) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: x[",0x19);
              poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->colValue->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"=u[",3);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
              lVar6 = 5;
              pcVar7 = "], z[";
              goto LAB_0036e652;
            }
          }
          else {
            dVar3 = ((*ppvVar1)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar9];
            dVar10 = 0.0;
            if ((dVar3 < 0.0) && (1e-07 < ABS(dVar3))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: l[",0x19);
              poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->colLower->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," = x[",5);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->colValue->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              lVar6 = 4;
              pcVar7 = ", z[";
LAB_0036e652:
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,lVar6);
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
              poVar5 = std::ostream::_M_insert<double>
                                 (((*ppvVar1)->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start[lVar9]);
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              dVar10 = ABS(((*ppvVar1)->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                           .super__Vector_impl_data._M_start[lVar9]);
            }
          }
        }
        else {
          dVar10 = 0.0;
          if (1e-07 < ABS(((*ppvVar1)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar9])) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[",0x21);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
            poVar5 = std::ostream::_M_insert<double>
                               ((state->colValue->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            lVar6 = 0xb;
            pcVar7 = ", u=inf, z[";
            goto LAB_0036e652;
          }
        }
        if (0.0 < dVar10) {
          details->violated = details->violated + 1;
          details->sum_violation_2 = dVar10 * dVar10 + details->sum_violation_2;
          if (details->max_violation <= dVar10 && dVar10 != details->max_violation) {
            details->max_violation = dVar10;
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < state->numCol);
  }
  if (0 < state->numRow) {
    lVar9 = 0;
    do {
      if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar9] != 0) {
        details->checked = details->checked + 1;
        dVar3 = (state->rowValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        dVar4 = (state->rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        iVar8 = (int)lVar9;
        if (1e-07 <= ABS(dVar4 - dVar3)) {
LAB_0036e91d:
          if ((dVar3 <= dVar4) ||
             (1e-07 <= ABS(dVar3 - (state->rowUpper->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_start[lVar9]))) {
            dVar11 = 0.0;
            if (((dVar4 < dVar3 + 1e-07) &&
                (dVar3 < (state->rowUpper->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar9] + 1e-07)) &&
               (1e-07 < ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar9]))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
              poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,": L= ",5);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->rowLower->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", Ax=",5);
              poVar5 = std::ostream::_M_insert<double>(dVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", U=",4);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->rowUpper->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", y=",4);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->rowDual->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              dVar11 = ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start[lVar9]);
            }
          }
          else {
            dVar11 = 0.0;
            if (1e-07 < (state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar9]) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
              poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,": L= ",5);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->rowLower->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", Ax=",5);
              poVar5 = std::ostream::_M_insert<double>(dVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", U=",4);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->rowUpper->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", y=",4);
              poVar5 = std::ostream::_M_insert<double>
                                 ((state->rowDual->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar9]);
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              dVar11 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                       .super__Vector_impl_data._M_start[lVar9];
            }
          }
        }
        else {
          if (ABS((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar9] - dVar3) < 1e-07) goto LAB_0036ec1d;
          if ((1e-07 <= ABS(dVar4 - dVar3)) ||
             ((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar9] <= dVar3)) goto LAB_0036e91d;
          dVar11 = 0.0;
          pdVar2 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar9;
          if (*pdVar2 <= -1e-07 && *pdVar2 != -1e-07) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": L= ",5);
            poVar5 = std::ostream::_M_insert<double>
                               ((state->rowLower->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", Ax=",5);
            poVar5 = std::ostream::_M_insert<double>(dVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", U=",4);
            poVar5 = std::ostream::_M_insert<double>
                               ((state->rowUpper->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", y=",4);
            poVar5 = std::ostream::_M_insert<double>
                               ((state->rowDual->super__Vector_base<double,_std::allocator<double>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar9]);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            dVar11 = -(state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar9];
          }
        }
        if (0.0 < dVar11) {
          details->violated = details->violated + 1;
          details->sum_violation_2 = dVar11 * dVar11 + details->sum_violation_2;
          if (details->max_violation <= dVar11 && dVar11 != details->max_violation) {
            details->max_violation = dVar11;
          }
        }
      }
LAB_0036ec1d:
      lVar9 = lVar9 + 1;
    } while (lVar9 < state->numRow);
  }
  if (details->violated == 0) {
    pcVar7 = "Dual feasible.\n";
    lVar9 = 0xf;
  }
  else {
    pcVar7 = "KKT check error: Dual feasibility fail.\n";
    lVar9 = 0x28;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar9);
  return;
}

Assistant:

void checkDualFeasibility(const State& state, KktConditionDetails& details) {
  details.type = KktCondition::kPrimalFeasibility;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // check values of z_j are dual feasible
  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i]) {
      details.checked++;
      double infeas = 0;
      // j not in L or U
      if (state.colLower[i] <= -kHighsInf && state.colUpper[i] >= kHighsInf) {
        if (fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l=-inf, x[" << i
                      << "]=" << state.colValue[i] << ", u=inf, z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in L: x=l and l<u
      else if (state.colValue[i] == state.colLower[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] < 0 && fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l[" << i
                      << "]=" << state.colLower[i] << " = x[" << i
                      << "]=" << state.colValue[i] << ", z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in U: x=u and l<u
      else if (state.colValue[i] == state.colUpper[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: x[" << i
                      << "]=" << state.colValue[i] << "=u[" << i << "], z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // check values of y_i are dual feasible
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;

      double rowV = state.rowValue[i];

      // L = Ax = U can be any sign
      if (fabs(state.rowLower[i] - rowV) < tol &&
          fabs(state.rowUpper[i] - rowV) < tol)
        continue;

      double infeas = 0;
      // L = Ax < U
      if (fabs(state.rowLower[i] - rowV) < tol && rowV < state.rowUpper[i]) {
        if (state.rowDual[i] < -tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = -state.rowDual[i];
        }
      }
      // L < Ax = U
      else if (state.rowLower[i] < rowV &&
               fabs(rowV - state.rowUpper[i]) < tol) {
        if (state.rowDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = state.rowDual[i];
        }
      }
      // L < Ax < U
      else if ((state.rowLower[i] < (rowV + tol)) &&
               (rowV < (state.rowUpper[i] + tol))) {
        if (fabs(state.rowDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = std::abs(state.rowDual[i]);
        }
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Dual feasible.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Dual feasibility fail.\n";
  }
}